

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O1

bool __thiscall FatSystem::findDirectory(FatSystem *this,FatPath *path,FatEntry *outputEntry)

{
  pointer pcVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  pointer this_00;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  vector<FatEntry,_std::allocator<FatEntry>_> entries;
  string local_128;
  uint local_108;
  uint local_104;
  long local_100;
  long *local_f8;
  ulong local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  undefined8 uStack_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  ulong local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  vector<FatEntry,_std::allocator<FatEntry>_> local_a0;
  FatPath *local_88;
  FatSystem *local_80;
  ulong local_78;
  string *local_70;
  char *local_68;
  string *local_60;
  FatEntry *local_58;
  long *local_50;
  size_t local_48;
  long local_40;
  undefined8 uStack_38;
  
  bVar15 = 0;
  local_88 = path;
  FatPath::getParts_abi_cxx11_(&local_b8,path);
  local_108 = (uint)this->rootDirectory;
  outputEntry->cluster = local_108;
  bVar13 = local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish ==
           local_b8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_80 = this;
  if (!bVar13) {
    local_60 = (string *)&outputEntry->longName;
    local_68 = &outputEntry->attributes;
    local_70 = (string *)&outputEntry->data;
    uVar11 = 0;
    local_58 = outputEntry;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)(local_b8.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar11));
      if (iVar5 != 0) {
        local_d8 = &local_c8;
        pcVar1 = local_b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p;
        local_100 = uVar11 * 0x20;
        local_78 = uVar11;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,pcVar1,
                   pcVar1 + local_b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length);
        uVar11 = local_d0 & 0xffffffff;
        if (uVar11 != 0) {
          uVar12 = 0;
          do {
            paVar3 = local_d8;
            iVar5 = tolower((int)local_d8->_M_local_buf[uVar12]);
            paVar3->_M_local_buf[uVar12] = (char)iVar5;
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
        }
        if (local_d8 == &local_c8) {
          local_128.field_2._8_8_ = local_c8._8_8_;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        }
        else {
          local_128._M_dataplus._M_p = (pointer)local_d8;
        }
        local_128.field_2._M_allocated_capacity._1_7_ = local_c8._M_allocated_capacity._1_7_;
        local_128.field_2._M_local_buf[0] = local_c8._M_local_buf[0];
        local_128._M_string_length = local_d0;
        local_d0 = 0;
        local_c8._M_local_buf[0] = '\0';
        local_d8 = &local_c8;
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((local_b8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                   local_100),(string *)&local_128);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,CONCAT71(local_c8._M_allocated_capacity._1_7_,
                                            local_c8._M_local_buf[0]) + 1);
        }
        getEntries(&local_a0,local_80,local_108,(int *)0x0,(bool *)0x0);
        if (local_a0.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_a0.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar6 = 0;
        }
        else {
          local_104 = 0;
          this_00 = local_a0.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            FatEntry::getFilename_abi_cxx11_(&local_128,this_00);
            bVar4 = FatEntry::isDirectory(this_00);
            if (bVar4) {
              local_f8 = (long *)&local_e8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f8,local_128._M_dataplus._M_p,
                         local_128._M_dataplus._M_p + local_128._M_string_length);
              uVar11 = local_f0 & 0xffffffff;
              if (uVar11 != 0) {
                uVar12 = 0;
                do {
                  plVar2 = local_f8;
                  iVar5 = tolower((int)*(char *)((long)local_f8 + uVar12));
                  *(char *)((long)plVar2 + uVar12) = (char)iVar5;
                  uVar12 = uVar12 + 1;
                } while (uVar11 != uVar12);
              }
              uVar11 = local_f0;
              if (local_f8 == (long *)&local_e8) {
                uStack_38 = uStack_e0;
                local_50 = &local_40;
              }
              else {
                local_50 = local_f8;
              }
              local_40 = CONCAT71(uStack_e7,local_e8);
              local_48 = local_f0;
              local_f0 = 0;
              local_e8 = 0;
              local_f8 = (long *)&local_e8;
              if (uVar11 != *(size_t *)
                             ((long)&(local_b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                             local_100)) goto LAB_0010d4e0;
              if (uVar11 == 0) {
                bVar14 = true;
              }
              else {
                iVar5 = bcmp(local_50,*(void **)((long)&((local_b8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + local_100),uVar11);
                bVar14 = iVar5 == 0;
              }
            }
            else {
LAB_0010d4e0:
              bVar14 = false;
            }
            if (bVar4) {
              if (local_50 != &local_40) {
                operator_delete(local_50,local_40 + 1);
              }
              if (local_f8 != (long *)&local_e8) {
                operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
              }
            }
            if (bVar14) {
              std::__cxx11::string::_M_assign((string *)local_58);
              std::__cxx11::string::_M_assign(local_60);
              pcVar9 = &this_00->attributes;
              pcVar10 = local_68;
              for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
                *(undefined8 *)pcVar10 = *(undefined8 *)pcVar9;
                pcVar9 = pcVar9 + ((ulong)bVar15 * -2 + 1) * 8;
                pcVar10 = pcVar10 + (ulong)bVar15 * -0x10 + 8;
              }
              local_68[0x48] = this_00->hasData;
              std::__cxx11::string::_M_assign(local_70);
              local_108 = this_00->cluster;
              local_104 = (uint)CONCAT71((uint7)(uint3)(local_108 >> 8),1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            this_00 = this_00 + 1;
            uVar6 = local_104;
          } while (this_00 !=
                   local_a0.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        if ((uVar6 & 1) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error: directory ",0x11);
          FatPath::getPath_abi_cxx11_(&local_128,local_88);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_128._M_dataplus._M_p,
                              local_128._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," not found",10);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          std::vector<FatEntry,_std::allocator<FatEntry>_>::~vector(&local_a0);
          break;
        }
        std::vector<FatEntry,_std::allocator<FatEntry>_>::~vector(&local_a0);
        uVar11 = local_78;
      }
      uVar11 = uVar11 + 1;
      uVar12 = (long)local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      bVar13 = uVar12 <= uVar11;
    } while (uVar11 < uVar12);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return bVar13;
}

Assistant:

bool FatSystem::findDirectory(FatPath &path, FatEntry &outputEntry)
{
    int cluster;
    vector<string> parts = path.getParts();
    cluster = rootDirectory;
    outputEntry.cluster = cluster;

    for (int i=0; i<parts.size(); i++) {
        if (parts[i] != "") {
            parts[i] = strtolower(parts[i]);
            vector<FatEntry> entries = getEntries(cluster);
            vector<FatEntry>::iterator it;
            bool found = false;

            for (it=entries.begin(); it!=entries.end(); it++) {
                FatEntry &entry = *it;
                string name = entry.getFilename();
                if (entry.isDirectory() && strtolower(name) == parts[i]) {
                    outputEntry = entry;
                    cluster = entry.cluster;
                    found = true;
                }
            }

            if (!found) {
                cerr << "Error: directory " << path.getPath() << " not found" << endl;
                return false;
            }
        }
    }

    return true;
}